

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFOutlineObjectHelper::QPDFOutlineObjectHelper
          (QPDFOutlineObjectHelper *this,QPDFObjectHandle *a_oh,QPDFOutlineDocumentHelper *dh,
          int depth)

{
  shared_ptr<QPDFOutlineObjectHelper::Members> *this_00;
  QPDFOutlineDocumentHelper *dh_00;
  bool bVar1;
  Members *__p;
  QPDFObjGen QVar2;
  allocator<char> local_109;
  QPDFOutlineObjectHelper *local_108;
  QPDFOutlineDocumentHelper *local_100;
  QPDFObjectHandle cur;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_c8 [48];
  QPDFOutlineObjectHelper new_ooh;
  set children;
  
  local_100 = dh;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_d8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)a_oh);
  QPDFObjectHelper::QPDFObjectHelper(&this->super_QPDFObjectHelper,(QPDFObjectHandle *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFOutlineObjectHelper_002afd30;
  local_108 = this;
  __p = (Members *)operator_new(0x30);
  this_00 = &this->m;
  __p->dh = local_100;
  (__p->parent).super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->parent).super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__p->kids).super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->kids).super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->kids).super__Vector_base<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<QPDFOutlineObjectHelper::Members,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<QPDFOutlineObjectHelper::Members,void>
            ((__shared_ptr<QPDFOutlineObjectHelper::Members,(__gnu_cxx::_Lock_policy)2> *)this_00,
             __p);
  if (depth < 0x33) {
    dh_00 = ((this_00->
             super___shared_ptr<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->dh;
    QVar2 = QPDFObjectHandle::getObjGen(a_oh);
    bVar1 = QPDFOutlineDocumentHelper::Accessor::checkSeen(dh_00,QVar2);
    if (!bVar1) {
      children.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_left =
           &children.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
            _M_impl.super__Rb_tree_header._M_header;
      children.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      children.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      children.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
      _M_impl.super__Rb_tree_header._M_node_count = 0;
      children.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_right =
           children.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
           _M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&new_ooh,"/First",(allocator<char> *)local_c8);
      QPDFObjectHandle::getKey(&cur,(string *)a_oh);
      std::__cxx11::string::~string((string *)&new_ooh);
      while( true ) {
        bVar1 = QPDFObjectHandle::isNull(&cur);
        if (bVar1) break;
        bVar1 = QPDFObjectHandle::isIndirect(&cur);
        if (!bVar1) break;
        QVar2 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)&cur);
        bVar1 = QPDFObjGen::set::add(&children,QVar2);
        if (!bVar1) break;
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_e8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&cur);
        QPDFOutlineObjectHelper(&new_ooh,(QPDFObjectHandle *)&local_e8,local_100,depth + 1);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
        std::make_shared<QPDFOutlineObjectHelper,QPDFOutlineObjectHelper&>
                  ((QPDFOutlineObjectHelper *)local_c8);
        std::__shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&((new_ooh.m.
                      super___shared_ptr<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->parent).
                    super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
        std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::push_back
                  (&((this_00->
                     super___shared_ptr<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->kids,&new_ooh);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,"/Next",&local_109);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_c8 + 0x20),(string *)&cur);
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&cur,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 0x20));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 0x28));
        std::__cxx11::string::~string((string *)local_c8);
        ~QPDFOutlineObjectHelper(&new_ooh);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&cur.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                   *)&children);
    }
  }
  return;
}

Assistant:

QPDFOutlineObjectHelper::QPDFOutlineObjectHelper(
    QPDFObjectHandle a_oh, QPDFOutlineDocumentHelper& dh, int depth) :
    QPDFObjectHelper(a_oh),
    m(new Members(dh))
{
    if (depth > 50) {
        // Not exercised in test suite, but was tested manually by temporarily changing max depth
        // to 1.
        return;
    }
    if (QPDFOutlineDocumentHelper::Accessor::checkSeen(m->dh, a_oh.getObjGen())) {
        QTC::TC("qpdf", "QPDFOutlineObjectHelper loop");
        return;
    }

    QPDFObjGen::set children;
    QPDFObjectHandle cur = a_oh.getKey("/First");
    while (!cur.isNull() && cur.isIndirect() && children.add(cur)) {
        QPDFOutlineObjectHelper new_ooh(cur, dh, 1 + depth);
        new_ooh.m->parent = std::make_shared<QPDFOutlineObjectHelper>(*this);
        m->kids.push_back(new_ooh);
        cur = cur.getKey("/Next");
    }
}